

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O2

int Mecab_load(Mecab *m,char *dicdir)

{
  int iVar1;
  char **argv;
  char *pcVar2;
  Model *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long *plVar4;
  
  if ((dicdir != (char *)0x0 && m != (Mecab *)0x0) && (*dicdir != '\0')) {
    Mecab_clear(m);
    argv = (char **)malloc(0x18);
    pcVar2 = strdup("mecab");
    *argv = pcVar2;
    pcVar2 = strdup("-d");
    argv[1] = pcVar2;
    pcVar2 = strdup(dicdir);
    argv[2] = pcVar2;
    pMVar3 = MeCab::createModel(3,argv);
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      free(argv[lVar5]);
    }
    free(argv);
    if (pMVar3 != (Model *)0x0) {
      iVar1 = (*pMVar3->_vptr_Model[3])(pMVar3);
      plVar4 = (long *)CONCAT44(extraout_var,iVar1);
      if (plVar4 == (long *)0x0) {
        (*pMVar3->_vptr_Model[7])(pMVar3);
      }
      else {
        iVar1 = (*pMVar3->_vptr_Model[4])(pMVar3);
        if ((void *)CONCAT44(extraout_var_00,iVar1) != (void *)0x0) {
          m->model = pMVar3;
          m->tagger = plVar4;
          m->lattice = (void *)CONCAT44(extraout_var_00,iVar1);
          return 1;
        }
        (*pMVar3->_vptr_Model[7])(pMVar3);
        (**(code **)(*plVar4 + 0xe8))(plVar4);
      }
    }
    fprintf(_stderr,"ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n",dicdir);
  }
  return 0;
}

Assistant:

BOOL Mecab_load(Mecab *m, const char *dicdir)
{
   int i;
   int argc = 3;
   char **argv;

   if(m == NULL)
      return FALSE;

   if(dicdir == NULL || strlen(dicdir) == 0)
      return FALSE;

   Mecab_clear(m);

   argv = (char **) malloc(sizeof(char *) * argc);

   argv[0] = strdup("mecab");
   argv[1] = strdup("-d");
   argv[2] = strdup(dicdir);

   MeCab::Model *model = MeCab::createModel(argc, argv);

   for(i = 0; i < argc; i++)
      free(argv[i]);
   free(argv);

   if(model == NULL) {
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Tagger *tagger = model->createTagger();
   if(tagger == NULL) {
      delete model;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Lattice *lattice = model->createLattice();
   if(lattice == NULL) {
      delete model;
      delete tagger;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   m->model = (void *) model;
   m->tagger = (void *) tagger;
   m->lattice = (void *) lattice;

   return TRUE;
}